

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O2

void __thiscall wabt::BinaryReaderLogging::LogType(BinaryReaderLogging *this,Type type)

{
  Stream *this_00;
  Index IVar1;
  Type local_38;
  string local_30;
  
  this_00 = this->stream_;
  local_38 = type;
  if (type.enum_ < Any) {
    Type::GetName_abi_cxx11_(&local_30,&local_38);
    Stream::Writef(this_00,"%s",local_30._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
  }
  else {
    IVar1 = Type::GetIndex(&local_38);
    Stream::Writef(this_00,"typeidx[%d]",(ulong)IVar1);
  }
  return;
}

Assistant:

void BinaryReaderLogging::LogType(Type type) {
  if (type.IsIndex()) {
    LOGF_NOINDENT("typeidx[%d]", type.GetIndex());
  } else {
    LOGF_NOINDENT("%s", type.GetName().c_str());
  }
}